

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11ResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen11Resource_TestPlanar2D_NV12_MediaCompressed_Test::TestBody
          (CTestGen11Resource_TestPlanar2D_NV12_MediaCompressed_Test *this)

{
  uint uVar1;
  bool bVar2;
  uint ExpectedValue;
  int iVar3;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  char *pcVar4;
  AssertHelper local_2c8;
  Message local_2c0;
  unsigned_long local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_10;
  uint32_t MediaStateOffset;
  uint32_t UVCcsSize;
  Message local_290;
  unsigned_long local_288;
  uint local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_9;
  uint32_t YCcsSize;
  Message local_258;
  unsigned_long local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_8;
  Message local_230;
  unsigned_long local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_7;
  Message local_208;
  unsigned_long local_200;
  uint local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_6;
  Message local_1d8;
  unsigned_long local_1d0;
  uint local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_5;
  Message local_1a8;
  undefined8 local_1a0;
  undefined4 local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_4;
  Message local_178;
  unsigned_long local_170;
  uint local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Message local_148;
  undefined8 local_140;
  undefined4 local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  Message local_118;
  undefined8 local_110;
  undefined4 local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8 [3];
  undefined8 local_d0;
  undefined4 local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  uint32_t Size;
  uint32_t Height;
  uint32_t Pitch;
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t TileSize [2];
  CTestGen11Resource_TestPlanar2D_NV12_MediaCompressed_Test *this_local;
  
  gmmParams.MultiTileArch._0_1_ = 0x80;
  gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
  gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
  gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
  gmmParams.MultiTileArch.Reserved = 0x20;
  gmmParams.MaximumRenamingListLength = 0;
  gmmParams.NoGfxMemory = '\0';
  gmmParams._109_3_ = 0;
  gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
  gmmParams.pExistingSysMem = 0;
  gmmParams.BaseAlignment = 0;
  gmmParams.OverridePitch = 0;
  gmmParams.RotateInfo = 0;
  gmmParams._84_4_ = 0;
  gmmParams.BaseHeight = 0;
  gmmParams.Depth = 0;
  gmmParams.MaxLod = 0;
  gmmParams.ArraySize = 0;
  gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
  gmmParams.MSAA.NumSamples = 0;
  gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
  gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
  ResourceInfo = (GMM_RESOURCE_INFO *)0x2;
  gmmParams.ExistingSysMemSize = 0x100000000;
  gmmParams.Type = 0x10000;
  gmmParams.Format = GMM_FORMAT_BC1_UNORM;
  gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x1000000000;
  gmmParams.CpTag = 0x2048;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth64 = 0x100000274;
  CTestResource::SetTileFlag((CTestResource *)this,(GMM_RESCREATE_PARAMS *)&ResourceInfo,TEST_TILEY)
  ;
  ResourceInfo = (GMM_RESOURCE_INFO *)CONCAT44(0x15d,ResourceInfo._0_4_);
  ResourceInfo_00 =
       (GMM_RESOURCE_INFO *)
       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                 (CommonULT::pGmmULTClientContext,(GMM_RESCREATE_PARAMS *)&ResourceInfo);
  ExpectedValue =
       gmmParams.MultiTileArch._0_4_ + -1 + gmmParams.CpTag & -gmmParams.MultiTileArch._0_4_;
  iVar3 = ((gmmParams.field_6.BaseWidth - 1) + gmmParams.MultiTileArch.Reserved &
          -gmmParams.MultiTileArch.Reserved) +
          (((gmmParams.field_6.BaseWidth >> 1) - 1) + gmmParams.MultiTileArch.Reserved &
          -gmmParams.MultiTileArch.Reserved);
  gtest_ar.message_.ptr_._4_4_ = ExpectedValue * iVar3 + 0xfff & 0xfffff000;
  CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo_00,ExpectedValue);
  CTestResource::VerifyResourcePitchInTiles<true>
            ((CTestResource *)this,ResourceInfo_00,
             ExpectedValue / (uint)gmmParams.MultiTileArch._0_4_);
  CTestResource::VerifyResourceSize<true>
            ((CTestResource *)this,ResourceInfo_00,(ulong)gtest_ar.message_.ptr_._4_4_);
  CTestResource::VerifyResourceHAlign<false>((CTestResource *)this,ResourceInfo_00,0);
  CTestResource::VerifyResourceVAlign<false>((CTestResource *)this,ResourceInfo_00,0);
  CTestResource::VerifyResourceQPitch<false>((CTestResource *)this,ResourceInfo_00,0);
  local_c4 = 0;
  local_d0 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,1);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            ((char *)local_c0,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",
             (unsigned_long *)&local_c4,&local_d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar2) {
    testing::Message::Message(local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x6a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_104 = 0;
  local_110 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,1);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            ((char *)local_100,"0",(int *)"ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",
             (unsigned_long *)&local_104,&local_110);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x6b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_134 = 0;
  local_140 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,2);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            ((char *)local_130,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",
             (unsigned_long *)&local_134,&local_140);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_148);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x6e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_164 = (gmmParams.MultiTileArch.Reserved - 1) + gmmParams.field_6.BaseWidth &
              -gmmParams.MultiTileArch.Reserved;
  local_170 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,2);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_160,
             "(((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) - (((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) & ((TileSize[1]) - 1)))"
             ,"ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",&local_164,&local_170);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar2) {
    testing::Message::Message(&local_178);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x6f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_194 = 0;
  local_1a0 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,3);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            ((char *)local_190,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",
             (unsigned_long *)&local_194,&local_1a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x70,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1c4 = (gmmParams.MultiTileArch.Reserved - 1) + gmmParams.field_6.BaseWidth &
              -gmmParams.MultiTileArch.Reserved;
  local_1d0 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,2);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_1c0,
             "(((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) - (((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) & ((TileSize[1]) - 1)))"
             ,"ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",&local_1c4,&local_1d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar2) {
    testing::Message::Message(&local_1d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x72,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_1f4 = (gmmParams.MultiTileArch.Reserved - 1) + gmmParams.field_6.BaseWidth &
              -gmmParams.MultiTileArch.Reserved;
  local_200 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,3);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_1f0,
             "(((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) - (((gmmParams.BaseHeight) + ((TileSize[1]) - 1)) & ((TileSize[1]) - 1)))"
             ,"ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",&local_1f4,&local_200);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(&local_208);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x73,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_228 = (**(code **)(*(long *)ResourceInfo_00 + 0x2a0))(ResourceInfo_00,1);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_220,"Size",
             "ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS)",
             (uint *)((long)&gtest_ar.message_.ptr_ + 4),&local_228);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar2) {
    testing::Message::Message(&local_230);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x76,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_250 = (**(code **)(*(long *)ResourceInfo_00 + 0x2a0))(ResourceInfo_00,2);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_248,"Size",
             "ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_Y_CCS)",
             (uint *)((long)&gtest_ar.message_.ptr_ + 4),&local_250);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar2) {
    testing::Message::Message(&local_258);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffda0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x77,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffda0,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffda0);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  gtest_ar_9.message_.ptr_._4_4_ =
       (((gmmParams.MultiTileArch.Reserved - 1) + gmmParams.field_6.BaseWidth &
        -gmmParams.MultiTileArch.Reserved) * ExpectedValue >> 10) + 0xfff & 0x7ff000;
  local_27c = gtest_ar.message_.ptr_._4_4_ + gtest_ar_9.message_.ptr_._4_4_;
  local_288 = (**(code **)(*(long *)ResourceInfo_00 + 0x2a0))(ResourceInfo_00,3);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_278,"Size + YCcsSize",
             "ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_UV_CCS)",&local_27c,&local_288);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar2) {
    testing::Message::Message(&local_290);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&MediaStateOffset,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&MediaStateOffset,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&MediaStateOffset);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  uVar1 = (gmmParams.field_6.BaseWidth - 1) + gmmParams.MultiTileArch.Reserved;
  gtest_ar_10.message_.ptr_._4_4_ =
       ((iVar3 + ((uVar1 & gmmParams.MultiTileArch.Reserved - 1) - uVar1)) * ExpectedValue >> 10) +
       0xfff & 0x7ff000;
  gtest_ar_10.message_.ptr_._0_4_ =
       gtest_ar.message_.ptr_._4_4_ + gtest_ar_9.message_.ptr_._4_4_ +
       gtest_ar_10.message_.ptr_._4_4_;
  local_2b8 = (**(code **)(*(long *)ResourceInfo_00 + 0x2a0))(ResourceInfo_00,5);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_2b0,"MediaStateOffset",
             "ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_COMP_STATE)",
             (uint *)&gtest_ar_10.message_,&local_2b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(&local_2c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11ResourceULT.cpp"
               ,0x7f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
            (CommonULT::pGmmULTClientContext,ResourceInfo_00);
  return;
}

Assistant:

TEST_F(CTestGen11Resource, TestPlanar2D_NV12_MediaCompressed)
{
    /* Test planar surface with hybrid UV planes where UV plane is half the size
    of Y and U/V data is packed together */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // [UV-Packing]
    // YccsYccsYccs
    // YccsYccsYccs
    // UVccsUVccsUVccs
    // UVccsUVccsUVccs

    const uint32_t TileSize[2] = {128, 32}; // TileY

    GMM_RESCREATE_PARAMS gmmParams        = {};
    gmmParams.Type                        = RESOURCE_2D;
    gmmParams.NoGfxMemory                 = 1;
    gmmParams.Flags.Gpu.MMC               = 1;
    gmmParams.Flags.Gpu.Texture           = 1;
    gmmParams.Flags.Gpu.UnifiedAuxSurface = 1;
    gmmParams.Flags.Info.TiledY           = 1;
    gmmParams.BaseWidth64                 = 0x2048; //8264
    gmmParams.BaseHeight                  = 0x274;  // 628
    gmmParams.Depth                       = 0x1;
    SetTileFlag(gmmParams, static_cast<TEST_TILE_TYPE>(TEST_TILEY));
    gmmParams.Format = GMM_FORMAT_NV12;

    GMM_RESOURCE_INFO *ResourceInfo;
    //__debugbreak();
    ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

    uint32_t Pitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[0]);

    uint32_t Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]) +
                   GMM_ULT_ALIGN(gmmParams.BaseHeight / 2, TileSize[1]);
    uint32_t Size = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

    VerifyResourcePitch<true>(ResourceInfo, Pitch);
    VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[0]);

    VerifyResourceSize<true>(ResourceInfo, Size);
    VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

    // Y plane should be at 0,0
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
    EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

    // U/V plane should be at end of Y plane
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
    EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));

    EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));
    EXPECT_EQ(GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]), ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

    // Y Plane CCS should be at the end of NV12 surface.
    EXPECT_EQ(Size, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS));
    EXPECT_EQ(Size, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_Y_CCS));

    // UV Plane CCS offset
    uint32_t YCcsSize = GMM_ULT_ALIGN(((GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[1]) * Pitch) / 1024), PAGE_SIZE);
    EXPECT_EQ(Size + YCcsSize, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_UV_CCS));

    uint32_t UVCcsSize        = GMM_ULT_ALIGN((Height - GFX_ALIGN(gmmParams.BaseHeight, TileSize[1])) * Pitch / 1024, PAGE_SIZE);
    uint32_t MediaStateOffset = Size + YCcsSize + UVCcsSize;
    EXPECT_EQ(MediaStateOffset, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_COMP_STATE));

    pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
}